

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineStencilTests.cpp
# Opt level: O3

TestStatus * __thiscall
vkt::pipeline::anon_unknown_0::StencilTestInstance::iterate
          (TestStatus *__return_storage_ptr__,StencilTestInstance *this)

{
  VkDevice *ppVVar1;
  TestLog *log;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  bool bVar5;
  VkResult VVar6;
  deUint32 queueFamilyIndex;
  DeviceInterface *pDVar7;
  VkDevice pVVar8;
  VkQueue pVVar9;
  pointer pVVar10;
  InstanceInterface *vk;
  VkPhysicalDevice physicalDevice;
  long lVar11;
  ulong uVar12;
  deUint32 *pdVar13;
  UniquePtr<tcu::TextureLevel,_de::DefaultDeleter<tcu::TextureLevel>_> result;
  vector<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_> cwVertices;
  TextureFormat tcuStencilFormat;
  TextureFormat tcuColorFormat;
  SimpleAllocator allocator;
  IVec3 local_3f4;
  UVec4 local_3e8;
  ColorVertexShader vertexShader;
  Program program;
  ColorFragmentShader fragmentShader;
  Vertex4RGBA cwVertex1;
  ReferenceRenderer refRenderer;
  VkSubmitInfo submitInfo;
  
  pDVar7 = Context::getDeviceInterface((this->super_TestInstance).m_context);
  pVVar8 = Context::getDevice((this->super_TestInstance).m_context);
  pVVar9 = Context::getUniversalQueue((this->super_TestInstance).m_context);
  submitInfo.pNext = (void *)0x0;
  submitInfo.pWaitDstStageMask = (VkPipelineStageFlags *)0x0;
  submitInfo.signalSemaphoreCount = 0;
  submitInfo._60_4_ = 0;
  submitInfo.pSignalSemaphores = (VkSemaphore *)0x0;
  submitInfo.waitSemaphoreCount = 0;
  submitInfo._20_4_ = 0;
  submitInfo.pWaitSemaphores = (VkSemaphore *)0x0;
  submitInfo.sType = VK_STRUCTURE_TYPE_SUBMIT_INFO;
  submitInfo._4_4_ = 0;
  submitInfo.commandBufferCount = 1;
  submitInfo._44_4_ = 0;
  submitInfo.pCommandBuffers = (VkCommandBuffer *)&this->m_cmdBuffer;
  VVar6 = (*pDVar7->_vptr_DeviceInterface[0x14])(pDVar7,pVVar8,1,&this->m_fence);
  ::vk::checkResult(VVar6,"vk.resetFences(vkDevice, 1, &m_fence.get())",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/pipeline/vktPipelineStencilTests.cpp"
                    ,0x37f);
  VVar6 = (*pDVar7->_vptr_DeviceInterface[2])
                    (pDVar7,pVVar9,1,&submitInfo,
                     (this->m_fence).super_RefBase<vk::Handle<(vk::HandleType)6>_>.m_data.object.
                     m_internal);
  ::vk::checkResult(VVar6,"vk.queueSubmit(queue, 1, &submitInfo, *m_fence)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/pipeline/vktPipelineStencilTests.cpp"
                    ,0x380);
  VVar6 = (*pDVar7->_vptr_DeviceInterface[0x16])
                    (pDVar7,pVVar8,1,&this->m_fence,1,0xffffffffffffffff);
  ::vk::checkResult(VVar6,"vk.waitForFences(vkDevice, 1, &m_fence.get(), true, ~(0ull) )",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/pipeline/vktPipelineStencilTests.cpp"
                    ,0x381);
  tcuColorFormat = ::vk::mapVkFormat(this->m_colorFormat);
  tcuStencilFormat = ::vk::mapVkFormat(this->m_stencilFormat);
  rr::VertexShader::VertexShader(&vertexShader.super_VertexShader,2,2);
  vertexShader.super_VertexShader._vptr_VertexShader = (_func_int **)&PTR_shadeVertices_00d27600;
  *(undefined8 *)
   vertexShader.super_VertexShader.m_inputs.
   super__Vector_base<rr::VertexInputInfo,_std::allocator<rr::VertexInputInfo>_>._M_impl.
   super__Vector_impl_data._M_start = 0;
  (vertexShader.super_VertexShader.m_outputs.
   super__Vector_base<rr::VertexVaryingInfo,_std::allocator<rr::VertexVaryingInfo>_>._M_impl.
   super__Vector_impl_data._M_start)->type = GENERICVECTYPE_FLOAT;
  vertexShader.super_VertexShader.m_outputs.
  super__Vector_base<rr::VertexVaryingInfo,_std::allocator<rr::VertexVaryingInfo>_>._M_impl.
  super__Vector_impl_data._M_start[1].type = GENERICVECTYPE_FLOAT;
  ColorFragmentShader::ColorFragmentShader(&fragmentShader,&tcuColorFormat,&tcuStencilFormat);
  program.geometryShader = (GeometryShader *)0x0;
  program.vertexShader = &vertexShader.super_VertexShader;
  program.fragmentShader = &fragmentShader.super_FragmentShader;
  ReferenceRenderer::ReferenceRenderer
            (&refRenderer,(this->m_renderSize).m_data[0],(this->m_renderSize).m_data[1],1,
             &tcuColorFormat,&tcuStencilFormat,&program);
  ReferenceRenderer::getViewportState(&refRenderer);
  allocator.super_Allocator._vptr_Allocator = (_func_int **)0x100000000;
  allocator.m_vk = (DeviceInterface *)0x0;
  allocator.m_device._0_4_ = 1.4013e-45;
  allocator.m_device._4_2_ = 2;
  allocator.m_device._6_2_ = 0;
  rr::FragmentOperationState::FragmentOperationState
            ((FragmentOperationState *)&allocator.m_memProps);
  allocator.m_memProps.memoryTypes[0x13].heapIndex = 0x3f800000;
  allocator.m_memProps.memoryTypes[0x14].propertyFlags =
       (VkMemoryPropertyFlags)cwVertex1.position.m_data[0];
  allocator.m_memProps.memoryTypes[0x14].heapIndex = (deUint32)cwVertex1.position.m_data[1];
  allocator.m_memProps.memoryTypes[0x15].propertyFlags =
       (VkMemoryPropertyFlags)cwVertex1.position.m_data[2];
  allocator.m_memProps.memoryTypes[0x15].heapIndex = (deUint32)cwVertex1.position.m_data[3];
  allocator.m_memProps.memoryTypes[0x16].propertyFlags =
       (VkMemoryPropertyFlags)cwVertex1.color.m_data[0];
  allocator.m_memProps.memoryTypes[0x16].heapIndex = (deUint32)cwVertex1.color.m_data[1];
  allocator.m_memProps.memoryTypes[0x17].propertyFlags = 0x3f800000;
  allocator.m_memProps.memoryTypes[0x17].heapIndex._0_1_ = 0;
  allocator.m_memProps.memoryTypes[0x18].propertyFlags = 0xffffffff;
  allocator.m_memProps.memoryTypes[0x18].heapIndex = 0;
  allocator.m_device._4_2_ = 0;
  allocator.m_device._6_2_ = 0;
  allocator.m_memProps.memoryTypes[9].heapIndex._0_1_ = 1;
  allocator.m_memProps.memoryTypes[10].propertyFlags = mapVkCompareOp(VK_COMPARE_OP_LESS);
  allocator.m_memProps.memoryTypes[2].propertyFlags._0_1_ = 1;
  allocator.m_memProps.memoryTypes[4].propertyFlags =
       mapVkStencilOp((this->m_stencilOpStateFront).failOp);
  allocator.m_memProps.memoryTypes[4].heapIndex =
       mapVkStencilOp((this->m_stencilOpStateFront).depthFailOp);
  allocator.m_memProps.memoryTypes[5].propertyFlags =
       mapVkStencilOp((this->m_stencilOpStateFront).passOp);
  allocator.m_memProps.memoryTypes[2].heapIndex =
       mapVkCompareOp((this->m_stencilOpStateFront).compareOp);
  allocator.m_memProps.memoryTypes[7].heapIndex =
       mapVkStencilOp((this->m_stencilOpStateBack).failOp);
  allocator.m_memProps.memoryTypes[8].propertyFlags =
       mapVkStencilOp((this->m_stencilOpStateBack).depthFailOp);
  allocator.m_memProps.memoryTypes[8].heapIndex =
       mapVkStencilOp((this->m_stencilOpStateBack).passOp);
  allocator.m_memProps.memoryTypes[6].propertyFlags =
       mapVkCompareOp((this->m_stencilOpStateBack).compareOp);
  std::vector<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>::vector
            (&cwVertices,&this->m_vertices);
  lVar11 = (long)cwVertices.
                 super__Vector_base<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>
                 ._M_impl.super__Vector_impl_data._M_finish -
           (long)cwVertices.
                 super__Vector_base<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>
                 ._M_impl.super__Vector_impl_data._M_start >> 5;
  if (lVar11 != 2) {
    pVVar10 = cwVertices.
              super__Vector_base<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>
              ._M_impl.super__Vector_impl_data._M_start + 2;
    uVar12 = 0;
    do {
      cwVertex1.position.m_data._0_8_ = *(undefined8 *)pVVar10[-1].position.m_data;
      cwVertex1.position.m_data._8_8_ = *(undefined8 *)(pVVar10[-1].position.m_data + 2);
      cwVertex1.color.m_data._0_8_ = *(undefined8 *)pVVar10[-1].color.m_data;
      cwVertex1.color.m_data._8_8_ = *(undefined8 *)(pVVar10[-1].color.m_data + 2);
      uVar2 = *(undefined8 *)((pVVar10->position).m_data + 2);
      uVar3 = *(undefined8 *)(pVVar10->color).m_data;
      uVar4 = *(undefined8 *)((pVVar10->color).m_data + 2);
      *(undefined8 *)pVVar10[-1].position.m_data = *(undefined8 *)(pVVar10->position).m_data;
      *(undefined8 *)(pVVar10[-1].position.m_data + 2) = uVar2;
      *(undefined8 *)pVVar10[-1].color.m_data = uVar3;
      *(undefined8 *)(pVVar10[-1].color.m_data + 2) = uVar4;
      *(undefined8 *)(pVVar10->position).m_data = cwVertex1.position.m_data._0_8_;
      *(undefined8 *)((pVVar10->position).m_data + 2) = cwVertex1.position.m_data._8_8_;
      *(undefined8 *)(pVVar10->color).m_data = cwVertex1.color.m_data._0_8_;
      *(undefined8 *)((pVVar10->color).m_data + 2) = cwVertex1.color.m_data._8_8_;
      uVar12 = uVar12 + 3;
      pVVar10 = pVVar10 + 3;
    } while (uVar12 < lVar11 - 2U);
  }
  lVar11 = 0xc0;
  pdVar13 = &DAT_00aeacd4;
  do {
    allocator.m_memProps.memoryTypes[3].propertyFlags = pdVar13[-3];
    allocator.m_memProps.memoryTypes[3].heapIndex = pdVar13[-5];
    allocator.m_memProps.memoryTypes[5].heapIndex = pdVar13[-4];
    allocator.m_memProps.memoryTypes[6].heapIndex = *pdVar13;
    allocator.m_memProps.memoryTypes[7].propertyFlags = pdVar13[-2];
    allocator.m_memProps.memoryTypes[9].propertyFlags = pdVar13[-1];
    std::vector<vkt::pipeline::Vertex4RGBA,std::allocator<vkt::pipeline::Vertex4RGBA>>::
    vector<__gnu_cxx::__normal_iterator<vkt::pipeline::Vertex4RGBA*,std::vector<vkt::pipeline::Vertex4RGBA,std::allocator<vkt::pipeline::Vertex4RGBA>>>,void>
              ((vector<vkt::pipeline::Vertex4RGBA,std::allocator<vkt::pipeline::Vertex4RGBA>> *)
               &cwVertex1,
               (Vertex4RGBA *)
               ((long)cwVertices.
                      super__Vector_base<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>
                      ._M_impl.super__Vector_impl_data._M_start[-6].position.m_data + lVar11),
               (Vertex4RGBA *)
               ((long)((cwVertices.
                        super__Vector_base<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>
                        ._M_impl.super__Vector_impl_data._M_start)->position).m_data + lVar11),
               (allocator_type *)&result);
    ReferenceRenderer::draw
              (&refRenderer,(RenderState *)&allocator,PRIMITIVETYPE_TRIANGLES,
               (vector<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_> *)
               &cwVertex1);
    if (cwVertex1.position.m_data._0_8_ != 0) {
      operator_delete((void *)cwVertex1.position.m_data._0_8_,
                      cwVertex1.color.m_data._0_8_ - cwVertex1.position.m_data._0_8_);
    }
    lVar11 = lVar11 + 0xc0;
    pdVar13 = pdVar13 + 6;
  } while (lVar11 != 0x3c0);
  if (cwVertices.
      super__Vector_base<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(cwVertices.
                    super__Vector_base<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)cwVertices.
                          super__Vector_base<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)cwVertices.
                          super__Vector_base<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  pDVar7 = Context::getDeviceInterface((this->super_TestInstance).m_context);
  pVVar8 = Context::getDevice((this->super_TestInstance).m_context);
  pVVar9 = Context::getUniversalQueue((this->super_TestInstance).m_context);
  queueFamilyIndex = Context::getUniversalQueueFamilyIndex((this->super_TestInstance).m_context);
  vk = Context::getInstanceInterface((this->super_TestInstance).m_context);
  physicalDevice = Context::getPhysicalDevice((this->super_TestInstance).m_context);
  ::vk::getPhysicalDeviceMemoryProperties
            ((VkPhysicalDeviceMemoryProperties *)&cwVertex1,vk,physicalDevice);
  ::vk::SimpleAllocator::SimpleAllocator
            (&allocator,pDVar7,pVVar8,(VkPhysicalDeviceMemoryProperties *)&cwVertex1);
  readColorAttachment((MovePtr<tcu::TextureLevel,_de::DefaultDeleter<tcu::TextureLevel>_> *)
                      &cwVertex1,pDVar7,pVVar8,pVVar9,queueFamilyIndex,&allocator.super_Allocator,
                      (VkImage)(this->m_colorImage).super_RefBase<vk::Handle<(vk::HandleType)9>_>.
                               m_data.object.m_internal,this->m_colorFormat,&this->m_renderSize);
  result.super_UniqueBase<tcu::TextureLevel,_de::DefaultDeleter<tcu::TextureLevel>_>.m_data.ptr =
       (TextureLevel *)cwVertex1.position.m_data._0_8_;
  cwVertex1.position.m_data[0] = 0.0;
  cwVertex1.position.m_data[1] = 0.0;
  de::details::UniqueBase<tcu::TextureLevel,_de::DefaultDeleter<tcu::TextureLevel>_>::reset
            ((UniqueBase<tcu::TextureLevel,_de::DefaultDeleter<tcu::TextureLevel>_> *)&cwVertex1);
  log = ((this->super_TestInstance).m_context)->m_testCtx->m_log;
  ReferenceRenderer::getAccess((PixelBufferAccess *)&cwVertex1,&refRenderer);
  tcu::TextureLevel::getAccess
            ((PixelBufferAccess *)&cwVertices,
             result.super_UniqueBase<tcu::TextureLevel,_de::DefaultDeleter<tcu::TextureLevel>_>.
             m_data.ptr);
  local_3e8.m_data[0] = 2;
  local_3e8.m_data[1] = 2;
  local_3e8.m_data[2] = 2;
  local_3e8.m_data[3] = 2;
  local_3f4.m_data[0] = 1;
  local_3f4.m_data[1] = 1;
  local_3f4.m_data[2] = 0;
  bVar5 = tcu::intThresholdPositionDeviationCompare
                    (log,"IntImageCompare","Image comparison",(ConstPixelBufferAccess *)&cwVertex1,
                     (ConstPixelBufferAccess *)&cwVertices,&local_3e8,&local_3f4,true,
                     COMPARE_LOG_RESULT);
  de::details::UniqueBase<tcu::TextureLevel,_de::DefaultDeleter<tcu::TextureLevel>_>::reset
            (&result.super_UniqueBase<tcu::TextureLevel,_de::DefaultDeleter<tcu::TextureLevel>_>);
  ppVVar1 = &allocator.m_device;
  allocator.super_Allocator._vptr_Allocator = (_func_int **)ppVVar1;
  if (bVar5) {
    cwVertex1.position.m_data[0] = 4.2039e-44;
    cwVertex1.position.m_data[1] = 0.0;
    allocator.super_Allocator._vptr_Allocator =
         (_func_int **)std::__cxx11::string::_M_create((ulong *)&allocator,(ulong)&cwVertex1);
    allocator.m_device._0_4_ = cwVertex1.position.m_data[0];
    allocator.m_device._4_2_ = cwVertex1.position.m_data[1]._0_2_;
    allocator.m_device._6_2_ = cwVertex1.position.m_data[1]._2_2_;
    builtin_strncpy((char *)((long)allocator.super_Allocator._vptr_Allocator + 0xe),"atches r",8);
    builtin_strncpy((char *)((long)allocator.super_Allocator._vptr_Allocator + 0x16),"eference",8);
    *(undefined4 *)allocator.super_Allocator._vptr_Allocator = 0x75736552;
    builtin_strncpy((char *)((long)allocator.super_Allocator._vptr_Allocator + 4),"lt i",4);
    *(undefined4 *)(allocator.super_Allocator._vptr_Allocator + 1) = 0x6567616d;
    builtin_strncpy((char *)((long)allocator.super_Allocator._vptr_Allocator + 0xc)," mat",4);
    allocator.m_vk = (DeviceInterface *)cwVertex1.position.m_data._0_8_;
    *(char *)((long)allocator.super_Allocator._vptr_Allocator + cwVertex1.position.m_data._0_8_) =
         '\0';
    __return_storage_ptr__->m_code = QP_TEST_RESULT_PASS;
    (__return_storage_ptr__->m_description)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->m_description).field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&__return_storage_ptr__->m_description,
               allocator.super_Allocator._vptr_Allocator,
               (char *)(cwVertex1.position.m_data._0_8_ +
                       (long)allocator.super_Allocator._vptr_Allocator));
  }
  else {
    allocator.m_device._0_4_ = 1.0645484e+24;
    allocator.m_device._4_2_ = 0x2065;
    allocator.m_device._6_2_ = 0x696d;
    allocator.m_memProps._0_6_ = 0x686374616d73;
    allocator.m_vk = (DeviceInterface *)0xe;
    allocator.m_memProps.memoryTypes[0].propertyFlags._2_1_ = 0;
    __return_storage_ptr__->m_code = QP_TEST_RESULT_FAIL;
    (__return_storage_ptr__->m_description)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->m_description).field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&__return_storage_ptr__->m_description,ppVVar1);
  }
  if ((VkDevice *)allocator.super_Allocator._vptr_Allocator != ppVVar1) {
    operator_delete(allocator.super_Allocator._vptr_Allocator,
                    CONCAT26(allocator.m_device._6_2_,
                             CONCAT24(allocator.m_device._4_2_,allocator.m_device._0_4_)) + 1);
  }
  ReferenceRenderer::~ReferenceRenderer(&refRenderer);
  rr::FragmentShader::~FragmentShader(&fragmentShader.super_FragmentShader);
  rr::VertexShader::~VertexShader(&vertexShader.super_VertexShader);
  return __return_storage_ptr__;
}

Assistant:

tcu::TestStatus StencilTestInstance::iterate (void)
{
	const DeviceInterface&		vk			= m_context.getDeviceInterface();
	const VkDevice				vkDevice	= m_context.getDevice();
	const VkQueue				queue		= m_context.getUniversalQueue();
	const VkSubmitInfo			submitInfo	=
	{
		VK_STRUCTURE_TYPE_SUBMIT_INFO,	// VkStructureType			sType;
		DE_NULL,						// const void*				pNext;
		0u,								// deUint32					waitSemaphoreCount;
		DE_NULL,						// const VkSemaphore*		pWaitSemaphores;
		(const VkPipelineStageFlags*)DE_NULL,
		1u,								// deUint32					commandBufferCount;
		&m_cmdBuffer.get(),				// const VkCommandBuffer*	pCommandBuffers;
		0u,								// deUint32					signalSemaphoreCount;
		DE_NULL							// const VkSemaphore*		pSignalSemaphores;
	};

	VK_CHECK(vk.resetFences(vkDevice, 1, &m_fence.get()));
	VK_CHECK(vk.queueSubmit(queue, 1, &submitInfo, *m_fence));
	VK_CHECK(vk.waitForFences(vkDevice, 1, &m_fence.get(), true, ~(0ull) /* infinity*/));

	return verifyImage();
}